

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall pegmatite::Context::restore(Context *this,ParsingState *st)

{
  ulong uVar1;
  pointer pPVar2;
  Index IVar3;
  Rule *pRVar4;
  Input *pIVar5;
  Index IVar6;
  int iVar7;
  int iVar8;
  ParseMatch *__cur;
  _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  *this_00;
  pointer pPVar9;
  undefined8 *puVar10;
  pointer pPVar11;
  long lVar12;
  pointer pPVar13;
  pointer pPVar14;
  ulong uVar15;
  ulong __n;
  long lVar16;
  ulong __n_00;
  
  iVar7 = (st->position).col;
  (this->position).line = (st->position).line;
  (this->position).col = iVar7;
  IVar3 = (st->position).it.idx;
  (this->position).it.buffer = (st->position).it.buffer;
  (this->position).it.idx = IVar3;
  uVar1 = st->matches;
  pPVar9 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar11 = (this->matches).
            super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pPVar11 - (long)pPVar9;
  uVar15 = (lVar16 >> 3) * 0x6db6db6db6db6db7;
  lVar12 = uVar15 - uVar1;
  if (uVar1 <= uVar15) {
    if ((uVar1 <= uVar15 && lVar12 != 0) && (pPVar9 = pPVar9 + uVar1, pPVar11 != pPVar9)) {
      (this->matches).
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
    }
  }
  else {
    __n_00 = uVar1 + (lVar16 >> 3) * -0x6db6db6db6db6db7;
    if (__n_00 != 0) {
      if ((ulong)(((long)(this->matches).
                         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar11 >> 3) *
                 0x6db6db6db6db6db7) < __n_00) {
        __n = __n_00;
        this_00 = (_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                   *)std::
                     vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                     ::_M_check_len(&this->matches,__n_00,"vector::_M_default_append");
        pPVar9 = std::
                 _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ::_M_allocate(this_00,__n);
        puVar10 = (undefined8 *)((long)pPVar9 + lVar16 + 0x28);
        lVar12 = uVar15 - uVar1;
        do {
          puVar10[-4] = 0;
          puVar10[-3] = 0xffffffffffffffff;
          puVar10[-1] = 0;
          *puVar10 = 0xffffffffffffffff;
          puVar10 = puVar10 + 7;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
        pPVar2 = (this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar11 = (this->matches).
                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar13 = pPVar9;
        for (pPVar14 = pPVar11; pPVar14 != pPVar2; pPVar14 = pPVar14 + 1) {
          iVar7 = (pPVar14->source).finish.col;
          (pPVar13->source).finish.line = (pPVar14->source).finish.line;
          (pPVar13->source).finish.col = iVar7;
          pRVar4 = pPVar14->matched_rule;
          pIVar5 = (pPVar14->source).start.it.buffer;
          IVar3 = (pPVar14->source).start.it.idx;
          iVar7 = (pPVar14->source).start.line;
          iVar8 = (pPVar14->source).start.col;
          IVar6 = (pPVar14->source).finish.it.idx;
          (pPVar13->source).finish.it.buffer = (pPVar14->source).finish.it.buffer;
          (pPVar13->source).finish.it.idx = IVar6;
          (pPVar13->source).start.it.idx = IVar3;
          (pPVar13->source).start.line = iVar7;
          (pPVar13->source).start.col = iVar8;
          pPVar13->matched_rule = pRVar4;
          (pPVar13->source).start.it.buffer = pIVar5;
          pPVar13 = pPVar13 + 1;
        }
        if (pPVar11 != (pointer)0x0) {
          operator_delete(pPVar11,(long)(this->matches).
                                        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pPVar11);
        }
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar9;
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)pPVar9 + __n_00 * 0x38 + lVar16);
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar9 + (long)this_00;
      }
      else {
        do {
          (pPVar11->source).start.it.buffer = (Input *)0x0;
          (pPVar11->source).start.it.idx = 0xffffffffffffffff;
          (pPVar11->source).finish.it.buffer = (Input *)0x0;
          (pPVar11->source).finish.it.idx = 0xffffffffffffffff;
          pPVar11 = pPVar11 + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
        (this->matches).
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar11;
      }
    }
  }
  return;
}

Assistant:

void restore(const ParsingState &st)
	{
		position = st.position;
		matches.resize(st.matches);
	}